

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  undefined4 *puVar1;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *this_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg_01;
  internal iVar2;
  type tVar3;
  long *plVar4;
  internal *piVar5;
  uint arg_id;
  internal *piVar6;
  internal *piVar7;
  basic_string_view<char> name;
  null_terminating_iterator<char> nVar8;
  error_handler local_51;
  width_checker<fmt::v5::internal::error_handler> local_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  plVar4 = (long *)it.end_;
  piVar5 = (internal *)it.ptr_;
  if (this == piVar5) {
    iVar2 = (internal)0x0;
  }
  else {
    iVar2 = *this;
    if ((iVar2 == (internal)0x7d) || (iVar2 == (internal)0x3a)) {
      puVar1 = *(undefined4 **)*plVar4;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::next_arg((format_arg *)&local_48.string,
                 (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                  *)((undefined8 *)*plVar4)[1]);
      local_50.handler_ = &local_51;
      arg.value_.field_0.string.size = local_48.string.size;
      arg.value_.field_0.long_long_value = local_48.long_long_value;
      arg._16_8_ = local_38;
      arg._24_8_ = uStack_30;
      tVar3 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        (&local_50,arg);
      if ((tVar3 & 0xffffffff80000000) != 0) {
        error_handler::on_error(&local_51,"number is too big");
      }
      *puVar1 = (int)tVar3;
      piVar7 = this;
      goto LAB_00128a33;
    }
    if ((byte)((char)iVar2 - 0x30U) < 10) {
      arg_id = 0;
      piVar6 = this + 1;
      do {
        if (0xccccccc < arg_id) goto LAB_00128a5a;
        arg_id = ((uint)(byte)iVar2 + arg_id * 10) - 0x30;
        piVar7 = piVar5;
        if (piVar6 == piVar5) break;
        iVar2 = *piVar6;
        piVar7 = piVar6;
        piVar6 = piVar6 + 1;
      } while ((byte)((char)iVar2 - 0x30U) < 10);
      if ((int)arg_id < 0) {
LAB_00128a5a:
        error_handler::on_error(*(error_handler **)(*plVar4 + 8),"number is too big");
      }
      if ((piVar7 != piVar5) && ((*piVar7 == (internal)0x3a || (*piVar7 == (internal)0x7d)))) {
        puVar1 = *(undefined4 **)*plVar4;
        this_00 = (context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                   *)((undefined8 *)*plVar4)[1];
        if (0 < (this_00->parse_context_).next_arg_id_) {
          error_handler::on_error
                    ((error_handler *)this_00,
                     "cannot switch from automatic to manual argument indexing");
        }
        (this_00->parse_context_).next_arg_id_ = -1;
        context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
        ::do_get_arg((format_arg *)&local_48.string,this_00,arg_id);
        local_50.handler_ = &local_51;
        arg_01.value_.field_0.string.size = local_48.string.size;
        arg_01.value_.field_0.long_long_value = local_48.long_long_value;
        arg_01._16_8_ = local_38;
        arg_01._24_8_ = uStack_30;
        tVar3 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                          (&local_50,arg_01);
        if ((tVar3 & 0xffffffff80000000) != 0) {
          error_handler::on_error(&local_51,"number is too big");
        }
        *puVar1 = (int)tVar3;
        goto LAB_00128a33;
      }
      goto LAB_00128981;
    }
  }
  if ((iVar2 != (internal)0x5f) && (0x19 < (byte)(((byte)iVar2 & 0xdf) + 0xbf))) {
LAB_00128981:
    error_handler::on_error(*(error_handler **)(*plVar4 + 8),"invalid format string");
  }
  name.size_ = 0;
  piVar6 = this + 1;
  do {
    piVar7 = piVar6;
    if (piVar7 == piVar5) {
      iVar2 = (internal)0x0;
    }
    else {
      iVar2 = *piVar7;
    }
    piVar6 = piVar7 + 1;
    name.size_ = name.size_ + 1;
  } while ((((byte)((char)iVar2 - 0x30U) < 10) || (iVar2 == (internal)0x5f)) ||
          ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a));
  if ((long)name.size_ < 0) {
    __assert_fail("(value >= 0) && \"negative value\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/core.h"
                  ,0xde,
                  "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                 );
  }
  puVar1 = *(undefined4 **)*plVar4;
  name.data_ = (char *)this;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
  get_arg((format_arg *)&local_48.string,
          (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
           *)((undefined8 *)*plVar4)[1],name);
  local_50.handler_ = &local_51;
  arg_00.value_.field_0.string.size = local_48.string.size;
  arg_00.value_.field_0.long_long_value = local_48.long_long_value;
  arg_00._16_8_ = local_38;
  arg_00._24_8_ = uStack_30;
  tVar3 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    (&local_50,arg_00);
  if ((tVar3 & 0xffffffff80000000) != 0) {
    error_handler::on_error(&local_51,"number is too big");
  }
  *puVar1 = (int)tVar3;
LAB_00128a33:
  nVar8.end_ = (char *)piVar5;
  nVar8.ptr_ = (char *)piVar7;
  return nVar8;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}